

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_flush(Curl_easy *data)

{
  size_t len_00;
  CURLcode result;
  ssize_t len;
  ssize_t bytes_written;
  smb_conn *smbc;
  connectdata *pcStack_20;
  curl_socket_t sockfd;
  connectdata *conn;
  Curl_easy *data_local;
  
  pcStack_20 = data->conn;
  smbc._4_4_ = pcStack_20->sock[0];
  bytes_written = (ssize_t)&pcStack_20->proto;
  len_00 = (pcStack_20->proto).ftpc.pp.response.tv_sec - (pcStack_20->proto).smbc.sent;
  if ((pcStack_20->proto).ftpc.pp.response.tv_sec == 0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    conn = (connectdata *)data;
    data_local._4_4_ =
         Curl_write(data,smbc._4_4_,(data->state).ulbuf + (pcStack_20->proto).smbc.sent,len_00,&len)
    ;
    if (data_local._4_4_ == CURLE_OK) {
      if (len == len_00) {
        *(undefined8 *)(bytes_written + 0x40) = 0;
      }
      else {
        *(ssize_t *)(bytes_written + 0x48) = len + *(long *)(bytes_written + 0x48);
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_flush(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  ssize_t len = smbc->send_size - smbc->sent;
  CURLcode result;

  if(!smbc->send_size)
    return CURLE_OK;

  result = Curl_write(data, sockfd,
                      data->state.ulbuf + smbc->sent,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len)
    smbc->sent += bytes_written;
  else
    smbc->send_size = 0;

  return CURLE_OK;
}